

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void ossaddsb_input(osgen_txtwin_t *win,char *p,int add_nl)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong len;
  
  for (sVar2 = strlen(p); sVar2 != 0; sVar2 = sVar2 - len) {
    iVar1 = (win->base).x;
    sVar3 = (win->base).wid;
    if ((int)sVar3 <= iVar1) {
      osssb_new_line(win);
      sVar3 = (win->base).wid;
      iVar1 = (win->base).x;
    }
    len = sVar3 - (long)iVar1;
    if (sVar2 < sVar3 - (long)iVar1) {
      len = sVar2;
    }
    ossaddsb(win,p,len,0);
    p = p + len;
  }
  if (add_nl != 0) {
    osssb_new_line(win);
    return;
  }
  osssb_add_safety_null(win);
  return;
}

Assistant:

void ossaddsb_input(osgen_txtwin_t *win, char *p, int add_nl)
{
    size_t chars_rem;
    
    /* get the number of characters in the input to add */
    chars_rem = strlen(p);

    /* 
     *   add the input in chunks, wrapping whenever we reach the right edge
     *   of the window 
     */
    while (chars_rem != 0)
    {
        size_t wid_rem;
        size_t cur;
        
        /* if we're already past the edge, add a newline */
        if (win->base.x >= (int)win->base.wid)
            osssb_new_line(win);

        /* figure out how much space we have */
        wid_rem = win->base.wid - win->base.x;

        /* add as much as we can, up to the width remaining */
        cur = chars_rem;
        if (cur > wid_rem)
            cur = wid_rem;

        /* add the text */
        ossaddsb(win, p, cur, FALSE);

        /* skip this chunk */
        p += cur;
        chars_rem -= cur;
    }

    /* add a newline after the input if desired */
    if (add_nl)
        osssb_new_line(win);
    else
        osssb_add_safety_null(win);
}